

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll_ifc_ftp.c
# Opt level: O0

int32_t ll_ftp_msg_process(ll_ftp_t *f,uint8_t *buf,uint8_t len)

{
  ll_ftp_state_t lVar1;
  int32_t local_20;
  int32_t ret;
  uint8_t len_local;
  uint8_t *buf_local;
  ll_ftp_t *f_local;
  
  lVar1 = f->state;
  if (lVar1 == IDLE) {
    local_20 = ll_ftp_idle_process_msg(f,buf,len);
  }
  else if (lVar1 == SEGMENT) {
    local_20 = ll_ftp_segment_process_msg(f,buf,len);
  }
  else if (lVar1 == APPLY) {
    local_20 = ll_ftp_apply_process_msg(f,buf,len);
  }
  else {
    local_20 = 4;
  }
  return local_20;
}

Assistant:

int32_t ll_ftp_msg_process(ll_ftp_t* f, uint8_t* buf, uint8_t len)
{
    int32_t ret = 0;
    switch (f->state)
    {
        case IDLE:
            ret = ll_ftp_idle_process_msg(f, buf, len);
            break;
        case SEGMENT:
            ret = ll_ftp_segment_process_msg(f, buf, len);
            break;
        case APPLY:
            ret = ll_ftp_apply_process_msg(f, buf, len);
            break;
        default:
            ret = LL_FTP_ERROR;
            break;
    }

    return ret;
}